

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

iterator __thiscall
QVLABase<QDialogButtonBox::ButtonRole>::emplace_impl<QDialogButtonBox::ButtonRole_const&>
          (QVLABase<QDialogButtonBox::ButtonRole> *this,qsizetype prealloc,void *array,
          const_iterator before,ButtonRole *args)

{
  const_iterator pBVar1;
  QVLABase<QDialogButtonBox::ButtonRole> *this_00;
  iterator pBVar2;
  iterator last;
  QVLABase<QDialogButtonBox::ButtonRole> *in_RCX;
  ButtonRole *in_RDI;
  iterator e;
  iterator b;
  qsizetype offset;
  void *in_stack_ffffffffffffffc0;
  qsizetype in_stack_ffffffffffffffc8;
  
  pBVar1 = cbegin((QVLABase<QDialogButtonBox::ButtonRole> *)0x676d8a);
  this_00 = (QVLABase<QDialogButtonBox::ButtonRole> *)((long)in_RCX - (long)pBVar1 >> 2);
  emplace_back_impl<QDialogButtonBox::ButtonRole_const&>
            (this_00,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_RDI);
  pBVar2 = begin((QVLABase<QDialogButtonBox::ButtonRole> *)0x676dc1);
  pBVar2 = pBVar2 + (long)this_00;
  last = end(in_RCX);
  QtPrivate::q_rotate<QDialogButtonBox::ButtonRole>((ButtonRole *)this_00,pBVar2,last);
  return pBVar2;
}

Assistant:

Q_OUTOFLINE_TEMPLATE auto QVLABase<T>::emplace_impl(qsizetype prealloc, void *array, const_iterator before, Args &&...args) -> iterator
{
    Q_ASSERT_X(isValidIterator(before), "QVarLengthArray::insert", "The specified const_iterator argument 'before' is invalid");
    Q_ASSERT(size() <= capacity());
    Q_ASSERT(capacity() > 0);

    const qsizetype offset = qsizetype(before - cbegin());
    emplace_back_impl(prealloc, array, std::forward<Args>(args)...);
    const auto b = begin() + offset;
    const auto e = end();
    QtPrivate::q_rotate(b, e - 1, e);
    return b;
}